

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DisconnectMethod(sqlite3_vtab *pVtab)

{
  int local_1c;
  int i;
  Fts3Table *p;
  sqlite3_vtab *pVtab_local;
  
  sqlite3_finalize((sqlite3_stmt *)pVtab[0x11].zErrMsg);
  for (local_1c = 0; local_1c < 0x28; local_1c = local_1c + 1) {
    sqlite3_finalize(*(sqlite3_stmt **)(&pVtab[4].nRef + (long)local_1c * 2));
  }
  sqlite3_free(*(void **)&pVtab[0x13].nRef);
  sqlite3_free(pVtab[0x12].pModule);
  sqlite3_free(*(void **)&pVtab[0x12].nRef);
  sqlite3_free(*(void **)&pVtab[3].nRef);
  sqlite3_free(pVtab[3].zErrMsg);
  (**(code **)(*(long *)pVtab[3].pModule + 0x10))(pVtab[3].pModule);
  sqlite3_free(pVtab);
  return 0;
}

Assistant:

static int fts3DisconnectMethod(sqlite3_vtab *pVtab){
  Fts3Table *p = (Fts3Table *)pVtab;
  int i;

  assert( p->nPendingData==0 );
  assert( p->pSegments==0 );

  /* Free any prepared statements held */
  sqlite3_finalize(p->pSeekStmt);
  for(i=0; i<SizeofArray(p->aStmt); i++){
    sqlite3_finalize(p->aStmt[i]);
  }
  sqlite3_free(p->zSegmentsTbl);
  sqlite3_free(p->zReadExprlist);
  sqlite3_free(p->zWriteExprlist);
  sqlite3_free(p->zContentTbl);
  sqlite3_free(p->zLanguageid);

  /* Invoke the tokenizer destructor to free the tokenizer. */
  p->pTokenizer->pModule->xDestroy(p->pTokenizer);

  sqlite3_free(p);
  return SQLITE_OK;
}